

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O2

int __thiscall CVmFormatterLog::open_log_file(CVmFormatterLog *this,char *fname)

{
  err_frame_t *peVar1;
  CVmException *pCVar2;
  int iVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  CVmNetFile *nf;
  long *plVar6;
  err_frame_t err_cur__;
  undefined4 extraout_var;
  
  puVar4 = (undefined8 *)_ZTW11G_err_frame();
  err_cur__.prv_ = (err_frame_t *)*puVar4;
  uVar5 = _ZTW11G_err_frame();
  *(err_frame_t **)uVar5 = &err_cur__;
  err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
  if (err_cur__.state_ == 0) {
    iVar3 = CVmNetFile::open(fname,0,0xe,2,"text/plain");
    nf = (CVmNetFile *)CONCAT44(extraout_var,iVar3);
  }
  else {
    nf = (CVmNetFile *)0x0;
  }
  peVar1 = err_cur__.prv_;
  if (err_cur__.state_ == 1) {
    err_cur__.state_ = 2;
    nf = (CVmNetFile *)0x0;
  }
  puVar4 = (undefined8 *)_ZTW11G_err_frame();
  *puVar4 = peVar1;
  if ((err_cur__.state_ & 0x4001U) != 0) {
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(byte *)*puVar4 & 2) != 0) {
      plVar6 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar6 + 0x10));
    }
    pCVar2 = err_cur__.exc_;
    plVar6 = (long *)_ZTW11G_err_frame();
    *(CVmException **)(*plVar6 + 0x10) = pCVar2;
    err_rethrow();
  }
  if ((err_cur__.state_ & 2U) != 0) {
    free(err_cur__.exc_);
  }
  iVar3 = open_log_file(this,nf);
  return iVar3;
}

Assistant:

int CVmFormatterLog::open_log_file(VMG_ const char *fname)
{
    CVmNetFile *nf = 0;
    err_try
    {
        /* create the network file descriptor */
        nf = CVmNetFile::open(
            vmg_ fname, 0, NETF_NEW, OSFTLOG, "text/plain");
    }